

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall gmath::PinholeCamera::setA(PinholeCamera *this,Matrix33d *AA)

{
  double *pdVar1;
  undefined8 uVar2;
  char *pcVar3;
  SMatrix<double,_3,_3> *in_RSI;
  long in_RDI;
  ostringstream out;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffdf8;
  allocator *paVar4;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe00;
  allocator local_1d9;
  string *in_stack_fffffffffffffe28;
  IOException *in_stack_fffffffffffffe30;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  SMatrix<double,_3,_3>::operator=((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),in_RSI);
  pdVar1 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),1,0);
  if ((*pdVar1 == 0.0) && (!NAN(*pdVar1))) {
    pdVar1 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),2,0);
    if ((*pdVar1 == 0.0) && (!NAN(*pdVar1))) {
      pdVar1 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),2,1);
      if ((*pdVar1 == 0.0) && (!NAN(*pdVar1))) {
        pdVar1 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 0xc0),2,2);
        if ((*pdVar1 == 1.0) && (!NAN(*pdVar1))) {
          return;
        }
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,"Invalid camera matrix: ");
  operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  uVar2 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  paVar4 = &local_1d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,pcVar3,paVar4);
  gutil::IOException::IOException(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  __cxa_throw(uVar2,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void PinholeCamera::setA(const Matrix33d &AA)
{
  A=AA;

  if (A(1, 0) != 0 || A(2, 0) != 0 || A(2, 1) != 0 || A(2, 2) != 1)
  {
    std::ostringstream out;
    out << "Invalid camera matrix: " << A;
    throw gutil::IOException(out.str().c_str());
  }
}